

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O1

int hash_c_batch(PMBTOKEN_METHOD *method,EC_SCALAR *out,CBB *points,size_t index)

{
  int iVar1;
  uint8_t *data;
  size_t len_00;
  uint uVar2;
  uint8_t *buf;
  size_t len;
  CBB cbb;
  uint8_t *local_70;
  size_t local_68;
  CBB local_60;
  
  if (index < 0x10000) {
    CBB_zero(&local_60);
    local_70 = (uint8_t *)0x0;
    uVar2 = 0;
    iVar1 = CBB_init(&local_60,0);
    if (iVar1 != 0) {
      iVar1 = CBB_add_bytes(&local_60,"DLEQ BATCH",0xb);
      if (iVar1 != 0) {
        data = CBB_data(points);
        len_00 = CBB_len(points);
        iVar1 = CBB_add_bytes(&local_60,data,len_00);
        if (iVar1 != 0) {
          iVar1 = CBB_add_u16(&local_60,(uint16_t)index);
          uVar2 = 0;
          if (iVar1 != 0) {
            iVar1 = CBB_finish(&local_60,&local_70,&local_68);
            if (iVar1 != 0) {
              iVar1 = (*method->hash_c)(method->group,out,local_70,local_68);
              uVar2 = (uint)(iVar1 != 0);
            }
          }
        }
      }
    }
    CBB_cleanup(&local_60);
    OPENSSL_free(local_70);
  }
  else {
    uVar2 = 0;
    ERR_put_error(0x20,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/pmbtoken.cc"
                  ,0x1e2);
  }
  return uVar2;
}

Assistant:

static int hash_c_batch(const PMBTOKEN_METHOD *method, EC_SCALAR *out,
                        const CBB *points, size_t index) {
  static const uint8_t kDLEQBatchLabel[] = "DLEQ BATCH";
  if (index > 0xffff) {
    // The protocol supports only two-byte batches.
    OPENSSL_PUT_ERROR(TRUST_TOKEN, ERR_R_OVERFLOW);
    return 0;
  }

  int ok = 0;
  CBB cbb;
  CBB_zero(&cbb);
  uint8_t *buf = NULL;
  size_t len;
  if (!CBB_init(&cbb, 0) ||
      !CBB_add_bytes(&cbb, kDLEQBatchLabel, sizeof(kDLEQBatchLabel)) ||
      !CBB_add_bytes(&cbb, CBB_data(points), CBB_len(points)) ||
      !CBB_add_u16(&cbb, (uint16_t)index) || !CBB_finish(&cbb, &buf, &len) ||
      !method->hash_c(method->group, out, buf, len)) {
    goto err;
  }

  ok = 1;

err:
  CBB_cleanup(&cbb);
  OPENSSL_free(buf);
  return ok;
}